

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

char * encode_seg_and_data(segment *s,char *buf)

{
  char *pcVar1;
  
  if (buf != (char *)0x0 && s != (segment *)0x0) {
    pcVar1 = encode_uint32(s->conv,buf);
    pcVar1 = encode_uint8(s->cmd,pcVar1);
    pcVar1 = encode_uint32(s->sn,pcVar1);
    pcVar1 = encode_uint8(s->frag,pcVar1);
    pcVar1 = encode_uint16(s->wnd,pcVar1);
    pcVar1 = encode_uint32(s->una,pcVar1);
    pcVar1 = encode_uint32(s->sendts,pcVar1);
    buf = encode_uint32(s->len,pcVar1);
    if ((ulong)s->len != 0) {
      memcpy(buf,s->data,(ulong)s->len);
      buf = buf + s->len;
    }
  }
  return buf;
}

Assistant:

static char *encode_seg_and_data(segment *s, char *buf) {
    if (!s || !buf) {
        return buf;
    }

    char *p = buf;
    // segment head size 24B
    p = encode_uint32(s->conv, p);
    p = encode_uint8(s->cmd, p);
    p = encode_uint32(s->sn, p);
    p = encode_uint8(s->frag, p);
    p = encode_uint16(s->wnd, p);
    p = encode_uint32(s->una, p);
    p = encode_uint32(s->sendts, p);
    p = encode_uint32(s->len, p);

    if (s->len > 0 && NULL != s->data) {
        memcpy(p, s->data, s->len);
        p += s->len;
    }
    return p;
}